

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  wchar_t wVar6;
  int iVar7;
  ImTextureID pvVar8;
  ImDrawCmd *pIVar9;
  ImDrawCmd *__dest;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pIVar9 = (this->CmdBuffer).Data;
  iVar11 = (this->CmdBuffer).Size;
  if ((pIVar9[(long)iVar11 + -1].ElemCount != 0) &&
     (pIVar9[(long)iVar11 + -1].TextureId != (this->_CmdHeader).TextureId)) {
    fVar1 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.z;
    if (fVar1 <= fVar2) {
      fVar3 = (this->_CmdHeader).ClipRect.y;
      fVar4 = (this->_CmdHeader).ClipRect.w;
      if (fVar3 <= fVar4) {
        pvVar8 = (this->_CmdHeader).TextureId;
        uVar5 = (this->_CmdHeader).VtxOffset;
        wVar6 = (this->IdxBuffer).Size;
        iVar11 = (this->CmdBuffer).Size;
        iVar7 = (this->CmdBuffer).Capacity;
        if (iVar11 == iVar7) {
          iVar11 = iVar11 + 1;
          if (iVar7 == 0) {
            iVar10 = 8;
          }
          else {
            iVar10 = iVar7 / 2 + iVar7;
          }
          if (iVar11 < iVar10) {
            iVar11 = iVar10;
          }
          if (iVar7 < iVar11) {
            __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
            pIVar9 = (this->CmdBuffer).Data;
            if (pIVar9 != (ImDrawCmd *)0x0) {
              memcpy(__dest,pIVar9,(long)(this->CmdBuffer).Size * 0x38);
              ImGui::MemFree((this->CmdBuffer).Data);
            }
            (this->CmdBuffer).Data = __dest;
            (this->CmdBuffer).Capacity = iVar11;
          }
        }
        pIVar9 = (this->CmdBuffer).Data;
        iVar11 = (this->CmdBuffer).Size;
        pIVar9[iVar11].ClipRect.x = fVar1;
        pIVar9[iVar11].ClipRect.y = fVar3;
        pIVar9[iVar11].ClipRect.z = fVar2;
        pIVar9[iVar11].ClipRect.w = fVar4;
        pIVar9[iVar11].TextureId = pvVar8;
        pIVar9[iVar11].VtxOffset = uVar5;
        pIVar9[iVar11].IdxOffset = wVar6;
        *(undefined8 *)&pIVar9[iVar11].ElemCount = 0;
        *(ImDrawCallback *)(&pIVar9[iVar11].ElemCount + 2) = (ImDrawCallback)0x0;
        pIVar9[iVar11].UserCallbackData = (void *)0x0;
        (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
        return;
      }
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x1d1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar9[(long)iVar11 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x221,"void ImDrawList::_OnChangedTextureID()");
  }
  if ((((1 < iVar11) && (pIVar9[(long)iVar11 + -1].ElemCount == 0)) &&
      (auVar13[0] = -(*(char *)&pIVar9[(long)iVar11 + -2].ClipRect.x ==
                     *(char *)&(this->_CmdHeader).ClipRect.x),
      auVar13[1] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.x + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
      auVar13[2] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.x + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
      auVar13[3] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.x + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
      auVar13[4] = -(*(char *)&pIVar9[(long)iVar11 + -2].ClipRect.y ==
                    *(char *)&(this->_CmdHeader).ClipRect.y),
      auVar13[5] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.y + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
      auVar13[6] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.y + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
      auVar13[7] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.y + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
      auVar13[8] = -(*(char *)&pIVar9[(long)iVar11 + -2].ClipRect.z ==
                    *(char *)&(this->_CmdHeader).ClipRect.z),
      auVar13[9] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.z + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
      auVar13[10] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.z + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
      auVar13[0xb] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.z + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
      auVar13[0xc] = -(*(char *)&pIVar9[(long)iVar11 + -2].ClipRect.w ==
                      *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar13[0xd] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar13[0xe] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar13[0xf] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar12[0] = -(*(char *)&pIVar9[(long)iVar11 + -2].ClipRect.w ==
                    *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar12[1] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar12[2] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar12[3] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].ClipRect.w + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar12[4] = -(*(char *)&pIVar9[(long)iVar11 + -2].TextureId ==
                    *(char *)&(this->_CmdHeader).TextureId),
      auVar12[5] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 1) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
      auVar12[6] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 2) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
      auVar12[7] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 3) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
      auVar12[8] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 4) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
      auVar12[9] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 5) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
      auVar12[10] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 6) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
      auVar12[0xb] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].TextureId + 7) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
      auVar12[0xc] = -((char)pIVar9[(long)iVar11 + -2].VtxOffset ==
                      (char)(this->_CmdHeader).VtxOffset),
      auVar12[0xd] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].VtxOffset + 1) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
      auVar12[0xe] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].VtxOffset + 2) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
      auVar12[0xf] = -(*(char *)((long)&pIVar9[(long)iVar11 + -2].VtxOffset + 3) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)),
      auVar12 = auVar12 & auVar13,
      (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff)) &&
     (pIVar9[(long)iVar11 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar11 + -1;
    return;
  }
  pIVar9[(long)iVar11 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}